

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::LanguageString(uint Language)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  sVar2 = 0;
  pcVar1 = (char *)0x0;
  if ((int)Language < 0x8001) {
    switch(Language) {
    case 1:
      sVar2 = 0xb;
      pcVar1 = "DW_LANG_C89";
      break;
    case 2:
      sVar2 = 9;
      pcVar1 = "DW_LANG_C";
      break;
    case 3:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_Ada83";
      break;
    case 4:
      sVar2 = 0x13;
      pcVar1 = "DW_LANG_C_plus_plus";
      break;
    case 5:
      sVar2 = 0xf;
      pcVar1 = "DW_LANG_Cobol74";
      break;
    case 6:
      sVar2 = 0xf;
      pcVar1 = "DW_LANG_Cobol85";
      break;
    case 7:
      sVar2 = 0x11;
      pcVar1 = "DW_LANG_Fortran77";
      break;
    case 8:
      sVar2 = 0x11;
      pcVar1 = "DW_LANG_Fortran90";
      break;
    case 9:
      sVar2 = 0x10;
      pcVar1 = "DW_LANG_Pascal83";
      break;
    case 10:
      sVar2 = 0xf;
      pcVar1 = "DW_LANG_Modula2";
      break;
    case 0xb:
      sVar2 = 0xc;
      pcVar1 = "DW_LANG_Java";
      break;
    case 0xc:
      sVar2 = 0xb;
      pcVar1 = "DW_LANG_C99";
      break;
    case 0xd:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_Ada95";
      break;
    case 0xe:
      sVar2 = 0x11;
      pcVar1 = "DW_LANG_Fortran95";
      break;
    case 0xf:
      sVar2 = 0xb;
      pcVar1 = "DW_LANG_PLI";
      break;
    case 0x10:
      sVar2 = 0xc;
      pcVar1 = "DW_LANG_ObjC";
      break;
    case 0x11:
      sVar2 = 0x16;
      pcVar1 = "DW_LANG_ObjC_plus_plus";
      break;
    case 0x12:
      sVar2 = 0xb;
      pcVar1 = "DW_LANG_UPC";
      break;
    case 0x13:
      sVar2 = 9;
      pcVar1 = "DW_LANG_D";
      break;
    case 0x14:
      sVar2 = 0xe;
      pcVar1 = "DW_LANG_Python";
      break;
    case 0x15:
      sVar2 = 0xe;
      pcVar1 = "DW_LANG_OpenCL";
      break;
    case 0x16:
      sVar2 = 10;
      pcVar1 = "DW_LANG_Go";
      break;
    case 0x17:
      sVar2 = 0xf;
      pcVar1 = "DW_LANG_Modula3";
      break;
    case 0x18:
      sVar2 = 0xf;
      pcVar1 = "DW_LANG_Haskell";
      break;
    case 0x19:
      sVar2 = 0x16;
      pcVar1 = "DW_LANG_C_plus_plus_03";
      break;
    case 0x1a:
      sVar2 = 0x16;
      pcVar1 = "DW_LANG_C_plus_plus_11";
      break;
    case 0x1b:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_OCaml";
      break;
    case 0x1c:
      sVar2 = 0xc;
      pcVar1 = "DW_LANG_Rust";
      break;
    case 0x1d:
      sVar2 = 0xb;
      pcVar1 = "DW_LANG_C11";
      break;
    case 0x1e:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_Swift";
      break;
    case 0x1f:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_Julia";
      break;
    case 0x20:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_Dylan";
      break;
    case 0x21:
      sVar2 = 0x16;
      pcVar1 = "DW_LANG_C_plus_plus_14";
      break;
    case 0x22:
      sVar2 = 0x11;
      pcVar1 = "DW_LANG_Fortran03";
      break;
    case 0x23:
      sVar2 = 0x11;
      pcVar1 = "DW_LANG_Fortran08";
      break;
    case 0x24:
      sVar2 = 0x14;
      pcVar1 = "DW_LANG_RenderScript";
      break;
    case 0x25:
      sVar2 = 0xd;
      pcVar1 = "DW_LANG_BLISS";
    }
  }
  else if (Language == 0x8001) {
    sVar2 = 0x16;
    pcVar1 = "DW_LANG_Mips_Assembler";
  }
  else if (Language == 0x8e57) {
    sVar2 = 0x1b;
    pcVar1 = "DW_LANG_GOOGLE_RenderScript";
  }
  else if (Language == 0xb000) {
    sVar2 = 0x16;
    pcVar1 = "DW_LANG_BORLAND_Delphi";
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::LanguageString(unsigned Language) {
  switch (Language) {
  default:
    return StringRef();
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  case DW_LANG_##NAME:                                                         \
    return "DW_LANG_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}